

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O1

bool __thiscall
crnlib::etc1_optimizer::evaluate_solution_fast
          (etc1_optimizer *this,etc1_solution_coordinates *coords,potential_solution *trial_solution
          ,potential_solution *pBest_solution)

{
  uint64 *puVar1;
  vector<unsigned_char> *this_00;
  byte bVar2;
  uchar uVar3;
  uint uVar4;
  uint uVar5;
  params *ppVar6;
  color_quad_u8 *pcVar7;
  uchar *puVar8;
  uint uVar9;
  bool bVar10;
  potential_solution *ppVar11;
  potential_solution *ppVar12;
  uint s;
  ulong uVar13;
  ulong uVar14;
  ulong __n;
  int iVar15;
  long lVar16;
  ulong uVar17;
  int result_1;
  int iVar18;
  uint uVar19;
  uint uVar20;
  int result;
  int iVar21;
  uint uVar22;
  int result_2;
  int iVar23;
  uint uVar24;
  undefined4 *puVar25;
  color_quad_u8 block_colors [4];
  uint block_inten_midpoints [3];
  uint block_inten [4];
  byte local_a8 [16];
  uint64 *local_98;
  ulong local_90;
  ulong local_88;
  undefined4 *local_80;
  long local_78;
  potential_solution *local_70;
  uint local_64 [7];
  etc1_solution_coordinates *local_48;
  potential_solution *local_40;
  ulong local_38;
  
  ppVar6 = this->m_pParams;
  if (ppVar6->m_constrain_against_base_color5 == true) {
    iVar18 = (uint)(coords->m_unscaled_color).field_0.field_0.r -
             (uint)(ppVar6->m_base_color5).field_0.field_0.r;
    iVar21 = (uint)(coords->m_unscaled_color).field_0.field_0.g -
             (uint)(ppVar6->m_base_color5).field_0.field_0.g;
    iVar23 = (uint)(coords->m_unscaled_color).field_0.field_0.b -
             (uint)(ppVar6->m_base_color5).field_0.field_0.b;
    iVar15 = iVar21;
    if (iVar18 < iVar21) {
      iVar15 = iVar18;
    }
    if (iVar23 <= iVar15) {
      iVar15 = iVar23;
    }
    if (-5 < iVar15) {
      if (iVar21 < iVar18) {
        iVar21 = iVar18;
      }
      if (iVar21 <= iVar23) {
        iVar21 = iVar23;
      }
      if (iVar21 < 4) goto LAB_0018cd1f;
    }
    trial_solution->m_valid = false;
  }
  else {
LAB_0018cd1f:
    bVar2 = (coords->m_unscaled_color).field_0.field_0.r;
    local_40 = pBest_solution;
    local_48 = coords;
    if (coords->m_color4 == true) {
      uVar22 = (uint)bVar2 << 4 | (uint)bVar2;
      uVar19 = (uint)(coords->m_unscaled_color).field_0.field_0.g;
      uVar19 = uVar19 << 4 | uVar19;
      uVar24 = (uint)(coords->m_unscaled_color).field_0.field_0.b;
      uVar24 = uVar24 << 4 | uVar24;
    }
    else {
      uVar22 = (uint)bVar2 << 3 | (uint)(bVar2 >> 2);
      bVar2 = (coords->m_unscaled_color).field_0.field_0.g;
      uVar19 = (uint)bVar2 << 3 | (uint)(bVar2 >> 2);
      bVar2 = (coords->m_unscaled_color).field_0.field_0.b;
      uVar24 = (uint)bVar2 << 3 | (uint)(bVar2 >> 2);
    }
    local_90 = (ulong)uVar22;
    if (0xfe < uVar22) {
      local_90 = 0xff;
    }
    if (0xfe < uVar19) {
      uVar19 = 0xff;
    }
    if (0xfe < uVar24) {
      uVar24 = 0xff;
    }
    uVar22 = ppVar6->m_num_src_pixels;
    __n = (ulong)uVar22;
    local_98 = &trial_solution->m_error;
    local_70 = trial_solution;
    trial_solution->m_error = 0xffffffffffffffff;
    local_38 = (ulong)(uVar22 - 1);
    lVar16 = 7;
    puVar25 = &DAT_001ac5f0;
    iVar15 = 0;
    local_88 = (ulong)uVar19;
    do {
      local_78 = lVar16;
      lVar16 = 0;
      do {
        iVar21 = puVar25[lVar16];
        iVar18 = iVar21 + (int)local_90;
        iVar23 = iVar21 + (int)local_88;
        iVar21 = iVar21 + uVar24;
        if (0xfe < iVar18) {
          iVar18 = 0xff;
        }
        if (iVar18 < 1) {
          iVar18 = iVar15;
        }
        if (0xfe < iVar23) {
          iVar23 = 0xff;
        }
        if (iVar23 < 1) {
          iVar23 = iVar15;
        }
        if (0xfe < iVar21) {
          iVar21 = 0xff;
        }
        if (iVar21 < 1) {
          iVar21 = iVar15;
        }
        local_a8[lVar16 * 4] = (byte)iVar18;
        local_a8[lVar16 * 4 + 1] = (byte)iVar23;
        local_a8[lVar16 * 4 + 2] = (byte)iVar21;
        local_a8[lVar16 * 4 + 3] = 0;
        local_64[lVar16 + 3] = iVar23 + iVar18 + iVar21;
        lVar16 = lVar16 + 1;
      } while (lVar16 != 4);
      local_80 = puVar25;
      local_64[0] = local_64[4] + local_64[3];
      local_64[1] = local_64[4] + local_64[5];
      local_64[2] = local_64[5] + local_64[6];
      pcVar7 = this->m_pParams->m_pSrc_pixels;
      uVar19 = this->m_pSorted_luma[local_38];
      if (uVar19 * 2 < local_64[4] + local_64[3]) {
        if ((local_64[3] < uVar19 || local_64[3] - uVar19 == 0) ||
           ((ulong)(local_64[3] - uVar19) < *local_98)) {
          memset((this->m_temp_selectors).m_p,0,__n);
          if (uVar22 == 0) {
LAB_0018d07c:
            uVar13 = 0;
          }
          else {
            uVar17 = 0;
            uVar13 = 0;
            do {
              iVar21 = (uint)local_a8[0] - (uint)pcVar7[uVar17].field_0.field_0.r;
              iVar18 = (uint)local_a8[1] - (uint)pcVar7[uVar17].field_0.field_0.g;
              iVar23 = (uint)local_a8[2] - (uint)pcVar7[uVar17].field_0.field_0.b;
              uVar13 = uVar13 + (uint)(iVar23 * iVar23 + iVar18 * iVar18 + iVar21 * iVar21);
              uVar17 = uVar17 + 1;
            } while (__n != uVar17);
          }
          goto LAB_0018d10e;
        }
LAB_0018d083:
        bVar10 = false;
      }
      else {
        uVar19 = *this->m_pSorted_luma;
        if (uVar19 * 2 < local_64[5] + local_64[6]) {
          uVar17 = 0;
          if (uVar22 == 0) {
            uVar13 = 0;
            uVar14 = uVar17;
          }
          else {
            uVar19 = 0;
            uVar13 = 0;
            do {
              uVar9 = this->m_pSorted_luma[uVar17] * 2;
              uVar20 = uVar19 + 1;
              if (uVar20 < 4) {
                uVar20 = 3;
              }
              do {
                uVar14 = (ulong)uVar19;
                uVar4 = local_64[uVar14];
                if (uVar9 < uVar4) {
                  uVar20 = this->m_pSorted_luma_indices[uVar17];
                  (this->m_temp_selectors).m_p[uVar20] = (uchar)uVar19;
                  iVar18 = (uint)local_a8[uVar14 * 4] - (uint)pcVar7[uVar20].field_0.field_0.r;
                  iVar23 = (uint)local_a8[uVar14 * 4 + 1] - (uint)pcVar7[uVar20].field_0.field_0.g;
                  iVar21 = (uint)local_a8[uVar14 * 4 + 2] - (uint)pcVar7[uVar20].field_0.field_0.b;
                  uVar13 = uVar13 + (uint)(iVar21 * iVar21 + iVar23 * iVar23 + iVar18 * iVar18);
                  uVar20 = uVar19;
                  break;
                }
                uVar19 = uVar19 + 1;
              } while (uVar20 != uVar19);
              uVar19 = uVar20;
              uVar14 = uVar17;
            } while ((uVar9 < uVar4) && (uVar17 = uVar17 + 1, uVar14 = __n, uVar17 != __n));
          }
          if ((uint)uVar14 < uVar22) {
            uVar14 = uVar14 & 0xffffffff;
            do {
              uVar19 = this->m_pSorted_luma_indices[uVar14];
              (this->m_temp_selectors).m_p[uVar19] = '\x03';
              iVar18 = (uint)local_a8[0xc] - (uint)pcVar7[uVar19].field_0.field_0.r;
              iVar23 = (uint)local_a8[0xd] - (uint)pcVar7[uVar19].field_0.field_0.g;
              iVar21 = (uint)local_a8[0xe] - (uint)pcVar7[uVar19].field_0.field_0.b;
              uVar13 = uVar13 + (uint)(iVar21 * iVar21 + iVar23 * iVar23 + iVar18 * iVar18);
              uVar14 = uVar14 + 1;
            } while (__n != uVar14);
          }
        }
        else {
          if ((local_64[6] <= uVar19 && uVar19 - local_64[6] != 0) &&
             (*local_98 <= (ulong)(uVar19 - local_64[6]))) goto LAB_0018d083;
          memset((this->m_temp_selectors).m_p,3,__n);
          if (uVar22 == 0) goto LAB_0018d07c;
          uVar17 = 0;
          uVar13 = 0;
          do {
            iVar21 = (uint)local_a8[0xc] - (uint)pcVar7[uVar17].field_0.field_0.r;
            iVar18 = (uint)local_a8[0xd] - (uint)pcVar7[uVar17].field_0.field_0.g;
            iVar23 = (uint)local_a8[0xe] - (uint)pcVar7[uVar17].field_0.field_0.b;
            uVar13 = uVar13 + (uint)(iVar23 * iVar23 + iVar18 * iVar18 + iVar21 * iVar21);
            uVar17 = uVar17 + 1;
          } while (__n != uVar17);
        }
LAB_0018d10e:
        if (uVar13 < *local_98) {
          local_70->m_error = uVar13;
          (local_70->m_coords).m_inten_table = (uint)local_78;
          puVar8 = (local_70->m_selectors).m_p;
          (local_70->m_selectors).m_p = (this->m_temp_selectors).m_p;
          (this->m_temp_selectors).m_p = puVar8;
          uVar5 = (local_70->m_selectors).m_size;
          (local_70->m_selectors).m_size = (this->m_temp_selectors).m_size;
          (this->m_temp_selectors).m_size = uVar5;
          uVar5 = (local_70->m_selectors).m_capacity;
          (local_70->m_selectors).m_capacity = (this->m_temp_selectors).m_capacity;
          (this->m_temp_selectors).m_capacity = uVar5;
          local_70->m_valid = true;
          if (uVar13 == 0) {
            bVar10 = true;
            goto LAB_0018d187;
          }
        }
        bVar10 = false;
      }
LAB_0018d187:
      ppVar12 = local_40;
      ppVar11 = local_70;
      if (bVar10) break;
      puVar25 = local_80 + -4;
      lVar16 = local_78 + -1;
    } while (local_78 != 0);
    uVar3 = (local_48->m_unscaled_color).field_0.field_0.r;
    (local_70->m_coords).m_unscaled_color.field_0.field_0.r = uVar3;
    (local_70->m_coords).m_unscaled_color.field_0.field_0.g =
         (local_48->m_unscaled_color).field_0.field_0.g;
    (local_70->m_coords).m_unscaled_color.field_0.field_0.b =
         (local_48->m_unscaled_color).field_0.field_0.b;
    (local_70->m_coords).m_unscaled_color.field_0.field_0.a =
         (local_48->m_unscaled_color).field_0.field_0.a;
    (local_70->m_coords).m_color4 = this->m_pParams->m_use_color4;
    if ((local_40 != (potential_solution *)0x0) && (*local_98 < local_40->m_error)) {
      puVar1 = &local_40->m_error;
      (local_40->m_coords).m_unscaled_color.field_0.field_0.r = uVar3;
      (local_40->m_coords).m_unscaled_color.field_0.field_0.g =
           (local_70->m_coords).m_unscaled_color.field_0.field_0.g;
      (local_40->m_coords).m_unscaled_color.field_0.field_0.b =
           (local_70->m_coords).m_unscaled_color.field_0.field_0.b;
      (local_40->m_coords).m_unscaled_color.field_0.field_0.a =
           (local_70->m_coords).m_unscaled_color.field_0.field_0.a;
      (local_40->m_coords).m_inten_table = (local_70->m_coords).m_inten_table;
      (local_40->m_coords).m_color4 = (local_70->m_coords).m_color4;
      if (local_40 != local_70) {
        if ((local_40->m_selectors).m_capacity < (local_70->m_selectors).m_size) {
          this_00 = &local_40->m_selectors;
          if (this_00->m_p != (uchar *)0x0) {
            crnlib_free(this_00->m_p);
            this_00->m_p = (uchar *)0x0;
            (ppVar12->m_selectors).m_size = 0;
            (ppVar12->m_selectors).m_capacity = 0;
          }
          elemental_vector::increase_capacity
                    ((elemental_vector *)this_00,(ppVar11->m_selectors).m_size,false,1,
                     (object_mover)0x0,false);
        }
        else if ((local_40->m_selectors).m_size != 0) {
          (local_40->m_selectors).m_size = 0;
        }
        memcpy((ppVar12->m_selectors).m_p,(ppVar11->m_selectors).m_p,
               (ulong)(ppVar11->m_selectors).m_size);
        (ppVar12->m_selectors).m_size = (ppVar11->m_selectors).m_size;
      }
      ppVar12->m_valid = *(bool *)(local_98 + 1);
      *puVar1 = *local_98;
      return true;
    }
  }
  return false;
}

Assistant:

bool etc1_optimizer::evaluate_solution_fast(const etc1_solution_coordinates& coords, potential_solution& trial_solution, potential_solution* pBest_solution)
    {
        if (m_pParams->m_constrain_against_base_color5)
        {
            const int dr = coords.m_unscaled_color.r - m_pParams->m_base_color5.r;
            const int dg = coords.m_unscaled_color.g - m_pParams->m_base_color5.g;
            const int db = coords.m_unscaled_color.b - m_pParams->m_base_color5.b;

            if ((math::minimum(dr, dg, db) < cETC1ColorDeltaMin) || (math::maximum(dr, dg, db) > cETC1ColorDeltaMax))
            {
                trial_solution.m_valid = false;
                return false;
            }
        }

        const color_quad_u8 base_color(coords.get_scaled_color());

        const uint n = m_pParams->m_num_src_pixels;
        CRNLIB_ASSERT(trial_solution.m_selectors.size() == n);

        trial_solution.m_error = cUINT64_MAX;

        for (int inten_table = cETC1IntenModifierValues - 1; inten_table >= 0; --inten_table)
        {
            const int* pInten_table = g_etc1_inten_tables[inten_table];

            uint block_inten[4];
            color_quad_u8 block_colors[4];
            for (uint s = 0; s < 4; s++)
            {
                const int yd = pInten_table[s];
                color_quad_u8 block_color(base_color.r + yd, base_color.g + yd, base_color.b + yd, 0);
                block_colors[s] = block_color;
                block_inten[s] = block_color.r + block_color.g + block_color.b;
            }

            // evaluate_solution_fast() enforces/assumesd a total ordering of the input colors along the intensity (1,1,1) axis to more quickly classify the inputs to selectors.
            // The inputs colors have been presorted along the projection onto this axis, and ETC1 block colors are always ordered along the intensity axis, so this classification is fast.
            // 0   1   2   3
            //   01  12  23
            const uint block_inten_midpoints[3] = { block_inten[0] + block_inten[1], block_inten[1] + block_inten[2], block_inten[2] + block_inten[3] };

            uint64 total_error = 0;
            const color_quad_u8* pSrc_pixels = m_pParams->m_pSrc_pixels;
            if ((m_pSorted_luma[n - 1] * 2) < block_inten_midpoints[0])
            {
                if (block_inten[0] > m_pSorted_luma[n - 1])
                {
                    const uint min_error = block_inten[0] - m_pSorted_luma[n - 1];
                    if (min_error >= trial_solution.m_error)
                    {
                        continue;
                    }
                }

                memset(&m_temp_selectors[0], 0, n);

                for (uint c = 0; c < n; c++)
                {
                    total_error += color::elucidian_distance(block_colors[0], pSrc_pixels[c], false);
                }
            }
            else if ((m_pSorted_luma[0] * 2) >= block_inten_midpoints[2])
            {
                if (m_pSorted_luma[0] > block_inten[3])
                {
                    const uint min_error = m_pSorted_luma[0] - block_inten[3];
                    if (min_error >= trial_solution.m_error)
                    {
                        continue;
                    }
                }

                memset(&m_temp_selectors[0], 3, n);

                for (uint c = 0; c < n; c++)
                {
                    total_error += color::elucidian_distance(block_colors[3], pSrc_pixels[c], false);
                }
            }
            else
            {
                uint cur_selector = 0, c;
                for (c = 0; c < n; c++)
                {
                    const uint y = m_pSorted_luma[c];
                    while ((y * 2) >= block_inten_midpoints[cur_selector])
                    {
                        if (++cur_selector > 2)
                        {
                            goto done;
                        }
                    }
                    const uint sorted_pixel_index = m_pSorted_luma_indices[c];
                    m_temp_selectors[sorted_pixel_index] = static_cast<uint8>(cur_selector);
                    total_error += color::elucidian_distance(block_colors[cur_selector], pSrc_pixels[sorted_pixel_index], false);
                }
            done:
                while (c < n)
                {
                    const uint sorted_pixel_index = m_pSorted_luma_indices[c];
                    m_temp_selectors[sorted_pixel_index] = 3;
                    total_error += color::elucidian_distance(block_colors[3], pSrc_pixels[sorted_pixel_index], false);
                    ++c;
                }
            }

            if (total_error < trial_solution.m_error)
            {
                trial_solution.m_error = total_error;
                trial_solution.m_coords.m_inten_table = inten_table;
                trial_solution.m_selectors.swap(m_temp_selectors);
                trial_solution.m_valid = true;
                if (!total_error)
                {
                    break;
                }
            }
        }
        trial_solution.m_coords.m_unscaled_color = coords.m_unscaled_color;
        trial_solution.m_coords.m_color4 = m_pParams->m_use_color4;

        bool success = false;
        if (pBest_solution)
        {
            if (trial_solution.m_error < pBest_solution->m_error)
            {
                *pBest_solution = trial_solution;
                success = true;
            }
        }

        return success;
    }